

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndicapi.cxx
# Opt level: O3

int ndiGetPHSRHandle(ndicapi *pol,int i)

{
  char cVar1;
  int i_1;
  uint uVar2;
  long lVar3;
  uint uVar4;
  int i_2;
  int iVar5;
  
  lVar3 = 0;
  uVar4 = 0;
  do {
    cVar1 = pol->PhsrReply[lVar3];
    iVar5 = -0x57;
    if (((5 < (byte)(cVar1 + 0x9fU)) && (iVar5 = -0x37, 5 < (byte)(cVar1 + 0xbfU))) &&
       (iVar5 = -0x30, 9 < (byte)(cVar1 - 0x30U))) break;
    uVar4 = uVar4 << 4 | iVar5 + cVar1;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 2);
  uVar2 = 0;
  if ((-1 < i) && (uVar2 = 0, i <= (int)uVar4)) {
    lVar3 = 0;
    uVar2 = 0;
    do {
      cVar1 = pol->PhsrReply[lVar3 + (ulong)(uint)i * 5 + 2];
      iVar5 = -0x57;
      if (((5 < (byte)(cVar1 + 0x9fU)) && (iVar5 = -0x37, 5 < (byte)(cVar1 + 0xbfU))) &&
         (iVar5 = -0x30, 9 < (byte)(cVar1 - 0x30U))) {
        return uVar2;
      }
      uVar2 = uVar2 << 4 | iVar5 + cVar1;
      lVar3 = lVar3 + 1;
    } while (lVar3 != 2);
  }
  return uVar2;
}

Assistant:

ndicapiExport int ndiGetPHSRHandle(ndicapi* pol, int i)
{
  char* dp;
  int n;

  dp = pol->PhsrReply;
  n = (int)ndiHexToUnsignedLong(dp, 2);
  dp += 2;

  if (i < 0 || i > n)
  {
    return 0;
  }
  dp += 5 * i;

  return (int)ndiHexToUnsignedLong(dp, 2);
}